

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_draw_text(char *text,int posX,int posY,int font_size,rf_color color)

{
  rf_vec2 position;
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(text);
  if (((int)sVar1 != 0) && ((rf__ctx->field_0).default_font.texture.id != 0)) {
    uVar2 = 10;
    if (10 < font_size) {
      uVar2 = (ulong)(uint)font_size;
    }
    position.y = (float)posY;
    position.x = (float)posX;
    rf_draw_string_ex((rf__ctx->field_0).default_font,text,(int)sVar1,position,(float)(int)uVar2,
                      (float)(uint)(uVar2 * 0x66666667 >> 0x22),color);
  }
  return;
}

Assistant:

RF_API void rf_draw_text(const char* text, int posX, int posY, int font_size, rf_color color) { rf_draw_string(text, strlen(text), posX, posY, font_size, color); }